

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppModel.cpp
# Opt level: O0

Scope * __thiscall hiberlite::Scope::full_abi_cxx11_(Scope *this)

{
  long lVar1;
  undefined1 local_a8 [48];
  undefined1 local_78 [64];
  undefined1 local_38 [40];
  Scope *this_local;
  
  this_local = this;
  prefix_abi_cxx11_((Scope *)local_38);
  lVar1 = std::__cxx11::string::size();
  std::__cxx11::string::~string((string *)local_38);
  if (lVar1 == 0) {
    table_abi_cxx11_(this);
  }
  else {
    table_abi_cxx11_((Scope *)local_78);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_78 + 0x20),(char *)local_78);
    prefix_abi_cxx11_((Scope *)local_a8);
    std::operator+(&this->_table,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_78 + 0x20));
    std::__cxx11::string::~string((string *)local_a8);
    std::__cxx11::string::~string((string *)(local_78 + 0x20));
    std::__cxx11::string::~string((string *)local_78);
  }
  return this;
}

Assistant:

std::string Scope::full()
{
	if(prefix().size())
		return table()+"_"+prefix();
	else
		return table();
}